

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_tls.cc
# Opt level: O3

int aead_tls_seal_scatter
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,
              size_t max_out_tag_len,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *extra_in,size_t extra_in_len,uint8_t *ad,size_t ad_len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  HMAC_CTX *ctx_00;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t __n;
  uint8_t buf [32];
  int local_19c;
  HMAC_CTX *local_198;
  ushort local_18e;
  uint local_18c;
  ulong local_188;
  int local_17c;
  uchar local_178 [64];
  uchar local_138 [264];
  
  if (*(int *)((long)&ctx->state + 0x1c) == 0) {
    iVar3 = 0x70;
    iVar6 = 0x80;
  }
  else if (in_len >> 0x1f == 0) {
    sVar7 = aead_tls_tag_len(ctx,in_len,extra_in_len);
    if (max_out_tag_len < sVar7) {
      iVar3 = 0x67;
      iVar6 = 0x8b;
    }
    else {
      sVar7 = EVP_AEAD_nonce_length(ctx->aead);
      if (sVar7 == nonce_len) {
        if (ad_len == 0xb) {
          local_18e = (ushort)in_len << 8 | (ushort)in_len >> 8;
          local_198 = (HMAC_CTX *)(&(ctx->state).alignment + 0x13);
          iVar3 = HMAC_Init_ex(local_198,(void *)0x0,0,(EVP_MD *)0x0,(ENGINE *)0x0);
          if (iVar3 == 0) {
            return 0;
          }
          iVar3 = HMAC_Update(local_198,ad,0xb);
          if (iVar3 == 0) {
            return 0;
          }
          iVar3 = HMAC_Update(local_198,(uchar *)&local_18e,2);
          if (iVar3 == 0) {
            return 0;
          }
          iVar3 = HMAC_Update(local_198,in,in_len);
          if (iVar3 == 0) {
            return 0;
          }
          iVar3 = HMAC_Final(local_198,local_178,&local_18c);
          if (iVar3 == 0) {
            return 0;
          }
          local_198 = (HMAC_CTX *)&ctx->state;
          uVar4 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)local_198);
          if (((uVar4 == 2) && ((ctx->state).opaque[0x141] == '\0')) &&
             (iVar3 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)local_198,(EVP_CIPHER *)0x0,(ENGINE *)0x0
                                         ,(uchar *)0x0,nonce), iVar3 == 0)) {
            return 0;
          }
          ctx_00 = local_198;
          iVar3 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)local_198,out,&local_19c,in,(int)in_len);
          if (iVar3 == 0) {
            return 0;
          }
          uVar5 = EVP_CIPHER_CTX_block_size((EVP_CIPHER_CTX *)ctx_00);
          local_188 = CONCAT44(0,uVar5);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_188;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_188 - (in_len & 0xffffffff) % (ulong)uVar5;
          __n = SUB168(auVar2 % auVar1,0);
          iVar3 = 0;
          if (__n != 0) {
            if ((local_19c + uVar5) - __n != in_len) {
              __assert_fail("len + block_size - early_mac_len == in_len",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                            ,0xc0,
                            "int aead_tls_seal_scatter(const EVP_AEAD_CTX *, uint8_t *, uint8_t *, size_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t)"
                           );
            }
            iVar3 = SUB164(auVar2 % auVar1,0);
            iVar6 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)local_198,local_138,&local_17c,local_178,
                                      iVar3);
            if (iVar6 == 0) {
              return 0;
            }
            if (local_17c != (int)local_188) {
              __assert_fail("buf_len == (int)block_size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                            ,199,
                            "int aead_tls_seal_scatter(const EVP_AEAD_CTX *, uint8_t *, uint8_t *, size_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t)"
                           );
            }
            memcpy(out + local_19c,local_138,local_188 - __n);
            memcpy(out_tag,local_138 + (local_188 - __n),__n);
          }
          iVar3 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)local_198,out_tag + __n,&local_19c,
                                    local_178 + __n,local_18c - iVar3);
          if (iVar3 == 0) {
            return 0;
          }
          sVar7 = __n + (long)local_19c;
          if (1 < (uint)local_188) {
            if (0x100 < (uint)local_188) {
              __assert_fail("block_size <= 256",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                            ,0xd4,
                            "int aead_tls_seal_scatter(const EVP_AEAD_CTX *, uint8_t *, uint8_t *, size_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t)"
                           );
            }
            uVar4 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)local_198);
            if (uVar4 != 2) {
              __assert_fail("EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) == EVP_CIPH_CBC_MODE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                            ,0xd5,
                            "int aead_tls_seal_scatter(const EVP_AEAD_CTX *, uint8_t *, uint8_t *, size_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t)"
                           );
            }
            uVar5 = (int)local_188 - (int)((local_18c + in_len) % local_188);
            if (uVar5 != 0) {
              memset(local_138,uVar5 - 1 & 0xff,(ulong)uVar5);
            }
            iVar3 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)local_198,out_tag + sVar7,&local_19c,
                                      local_138,uVar5);
            if (iVar3 == 0) {
              return 0;
            }
            sVar7 = sVar7 + (long)local_19c;
          }
          iVar3 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)local_198,out_tag + sVar7,&local_19c);
          if (iVar3 == 0) {
            return 0;
          }
          if (local_19c != 0) {
            __assert_fail("len == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                          ,0xe5,
                          "int aead_tls_seal_scatter(const EVP_AEAD_CTX *, uint8_t *, uint8_t *, size_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t)"
                         );
          }
          sVar8 = aead_tls_tag_len(ctx,in_len,extra_in_len);
          if (sVar7 != sVar8) {
            __assert_fail("tag_len == aead_tls_tag_len(ctx, in_len, extra_in_len)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                          ,0xe6,
                          "int aead_tls_seal_scatter(const EVP_AEAD_CTX *, uint8_t *, uint8_t *, size_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t, const uint8_t *, const size_t)"
                         );
          }
          *out_tag_len = sVar7;
          return 1;
        }
        iVar3 = 0x6d;
        iVar6 = 0x95;
      }
      else {
        iVar3 = 0x6f;
        iVar6 = 0x90;
      }
    }
  }
  else {
    iVar3 = 0x75;
    iVar6 = 0x86;
  }
  ERR_put_error(0x1e,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                ,iVar6);
  return 0;
}

Assistant:

static int aead_tls_seal_scatter(const EVP_AEAD_CTX *ctx, uint8_t *out,
                                 uint8_t *out_tag, size_t *out_tag_len,
                                 const size_t max_out_tag_len,
                                 const uint8_t *nonce, const size_t nonce_len,
                                 const uint8_t *in, const size_t in_len,
                                 const uint8_t *extra_in,
                                 const size_t extra_in_len, const uint8_t *ad,
                                 const size_t ad_len) {
  AEAD_TLS_CTX *tls_ctx = (AEAD_TLS_CTX *)&ctx->state;

  if (!tls_ctx->cipher_ctx.encrypt) {
    // Unlike a normal AEAD, a TLS AEAD may only be used in one direction.
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_INVALID_OPERATION);
    return 0;
  }

  if (in_len > INT_MAX) {
    // EVP_CIPHER takes int as input.
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  if (max_out_tag_len < aead_tls_tag_len(ctx, in_len, extra_in_len)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (nonce_len != EVP_AEAD_nonce_length(ctx->aead)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_INVALID_NONCE_SIZE);
    return 0;
  }

  if (ad_len != 13 - 2 /* length bytes */) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_INVALID_AD_SIZE);
    return 0;
  }

  // To allow for CBC mode which changes cipher length, |ad| doesn't include the
  // length for legacy ciphers.
  uint8_t ad_extra[2];
  ad_extra[0] = (uint8_t)(in_len >> 8);
  ad_extra[1] = (uint8_t)(in_len & 0xff);

  // Compute the MAC. This must be first in case the operation is being done
  // in-place.
  uint8_t mac[EVP_MAX_MD_SIZE];
  unsigned mac_len;
  if (!HMAC_Init_ex(&tls_ctx->hmac_ctx, NULL, 0, NULL, NULL) ||
      !HMAC_Update(&tls_ctx->hmac_ctx, ad, ad_len) ||
      !HMAC_Update(&tls_ctx->hmac_ctx, ad_extra, sizeof(ad_extra)) ||
      !HMAC_Update(&tls_ctx->hmac_ctx, in, in_len) ||
      !HMAC_Final(&tls_ctx->hmac_ctx, mac, &mac_len)) {
    return 0;
  }

  // Configure the explicit IV.
  if (EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) == EVP_CIPH_CBC_MODE &&
      !tls_ctx->implicit_iv &&
      !EVP_EncryptInit_ex(&tls_ctx->cipher_ctx, NULL, NULL, NULL, nonce)) {
    return 0;
  }

  // Encrypt the input.
  int len;
  if (!EVP_EncryptUpdate(&tls_ctx->cipher_ctx, out, &len, in, (int)in_len)) {
    return 0;
  }

  unsigned block_size = EVP_CIPHER_CTX_block_size(&tls_ctx->cipher_ctx);

  // Feed the MAC into the cipher in two steps. First complete the final partial
  // block from encrypting the input and split the result between |out| and
  // |out_tag|. Then feed the rest.

  const size_t early_mac_len = (block_size - (in_len % block_size)) % block_size;
  if (early_mac_len != 0) {
    assert(len + block_size - early_mac_len == in_len);
    uint8_t buf[EVP_MAX_BLOCK_LENGTH];
    int buf_len;
    if (!EVP_EncryptUpdate(&tls_ctx->cipher_ctx, buf, &buf_len, mac,
                           (int)early_mac_len)) {
      return 0;
    }
    assert(buf_len == (int)block_size);
    OPENSSL_memcpy(out + len, buf, block_size - early_mac_len);
    OPENSSL_memcpy(out_tag, buf + block_size - early_mac_len, early_mac_len);
  }
  size_t tag_len = early_mac_len;

  if (!EVP_EncryptUpdate(&tls_ctx->cipher_ctx, out_tag + tag_len, &len,
                         mac + tag_len, mac_len - tag_len)) {
    return 0;
  }
  tag_len += len;

  if (block_size > 1) {
    assert(block_size <= 256);
    assert(EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) == EVP_CIPH_CBC_MODE);

    // Compute padding and feed that into the cipher.
    uint8_t padding[256];
    unsigned padding_len = block_size - ((in_len + mac_len) % block_size);
    OPENSSL_memset(padding, padding_len - 1, padding_len);
    if (!EVP_EncryptUpdate(&tls_ctx->cipher_ctx, out_tag + tag_len, &len,
                           padding, (int)padding_len)) {
      return 0;
    }
    tag_len += len;
  }

  if (!EVP_EncryptFinal_ex(&tls_ctx->cipher_ctx, out_tag + tag_len, &len)) {
    return 0;
  }
  assert(len == 0);  // Padding is explicit.
  assert(tag_len == aead_tls_tag_len(ctx, in_len, extra_in_len));

  *out_tag_len = tag_len;
  return 1;
}